

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

OSType parseOS(StringRef OSName)

{
  int iVar1;
  OSType *pOVar2;
  ulong uVar3;
  long *__s1;
  AlignedCharArray<4UL,_4UL> AVar4;
  bool bVar5;
  Optional<llvm::Triple::OSType> local_30;
  
  uVar3 = OSName.Length;
  __s1 = (long *)OSName.Data;
  local_30.Storage.hasVal = false;
  if (uVar3 < 6) {
LAB_0017364d:
    bVar5 = 5 < uVar3;
LAB_0017365d:
    if ((uVar3 < 6 || bVar5) || (iVar1 = bcmp(__s1,"darwin",6), iVar1 != 0)) {
      if ((uVar3 < 9 || bVar5) || (iVar1 = bcmp(__s1,"dragonfly",9), iVar1 != 0)) {
        if ((uVar3 < 7 || bVar5) || (iVar1 = bcmp(__s1,"freebsd",7), iVar1 != 0)) {
          if ((uVar3 < 7 || bVar5) || (iVar1 = bcmp(__s1,"fuchsia",7), iVar1 != 0)) {
            if ((uVar3 < 3 || bVar5) || (iVar1 = bcmp(__s1,"ios",3), iVar1 != 0)) {
              if ((uVar3 < 8 || bVar5) || (*__s1 != 0x647362656572666b)) {
                if ((uVar3 < 5 || bVar5) || (iVar1 = bcmp(__s1,"linux",5), iVar1 != 0)) {
                  if ((uVar3 < 3 || bVar5) || (iVar1 = bcmp(__s1,"lv2",3), iVar1 != 0)) {
                    if ((uVar3 < 5 || bVar5) || (iVar1 = bcmp(__s1,"macos",5), iVar1 != 0)) {
                      if ((uVar3 < 6 || bVar5) || (iVar1 = bcmp(__s1,"netbsd",6), iVar1 != 0)) {
                        if ((uVar3 < 7 || bVar5) || (iVar1 = bcmp(__s1,"openbsd",7), iVar1 != 0)) {
                          if ((uVar3 < 7 || bVar5) || (iVar1 = bcmp(__s1,"solaris",7), iVar1 != 0))
                          {
                            AVar4.buffer[0] = '\x0f';
                            AVar4.buffer[1] = '\0';
                            AVar4.buffer[2] = '\0';
                            AVar4.buffer[3] = '\0';
                            if (((uVar3 < 5 || bVar5) || (iVar1 = bcmp(__s1,"win32",5), iVar1 != 0))
                               && ((uVar3 < 7 || bVar5 ||
                                   (iVar1 = bcmp(__s1,"windows",7), iVar1 != 0)))) {
                              if ((uVar3 < 5 || bVar5) || (iVar1 = bcmp(__s1,"haiku",5), iVar1 != 0)
                                 ) {
                                if ((uVar3 < 5 || bVar5) ||
                                   (iVar1 = bcmp(__s1,"minix",5), iVar1 != 0)) {
                                  if ((uVar3 < 5 || bVar5) ||
                                     (iVar1 = bcmp(__s1,"rtems",5), iVar1 != 0)) {
                                    if ((uVar3 < 4 || bVar5) || ((int)*__s1 != 0x6c63616e)) {
                                      if ((uVar3 < 3 || bVar5) ||
                                         (iVar1 = bcmp(__s1,"cnk",3), iVar1 != 0)) {
                                        if ((uVar3 < 3 || bVar5) ||
                                           (iVar1 = bcmp(__s1,"aix",3), iVar1 != 0)) {
                                          if ((uVar3 < 4 || bVar5) || ((int)*__s1 != 0x61647563)) {
                                            if ((uVar3 < 4 || bVar5) || ((int)*__s1 != 0x6c63766e))
                                            {
                                              if ((uVar3 < 6 || bVar5) ||
                                                 (iVar1 = bcmp(__s1,"amdhsa",6), iVar1 != 0)) {
                                                if ((uVar3 < 3 || bVar5) ||
                                                   (iVar1 = bcmp(__s1,"ps4",3), iVar1 != 0)) {
                                                  if ((uVar3 < 8 || bVar5) ||
                                                     (*__s1 != 0x75636d6169666c65)) {
                                                    if ((uVar3 < 4 || bVar5) ||
                                                       ((int)*__s1 != 0x736f7674)) {
                                                      if ((uVar3 < 7 || bVar5) ||
                                                         (iVar1 = bcmp(__s1,"watchos",7), iVar1 != 0
                                                         )) {
                                                        if ((uVar3 < 6 || bVar5) ||
                                                           (iVar1 = bcmp(__s1,"mesa3d",6),
                                                           iVar1 != 0)) {
                                                          if ((uVar3 < 7 || bVar5) ||
                                                             (iVar1 = bcmp(__s1,"contiki",7),
                                                             iVar1 != 0)) {
                                                            if ((uVar3 < 6 || bVar5) ||
                                                               (iVar1 = bcmp(__s1,"amdpal",6),
                                                               iVar1 != 0)) {
                                                              if (!bVar5) {
                                                                return UnknownOS;
                                                              }
                                                              goto LAB_00173b0f;
                                                            }
                                                            AVar4.buffer[0] = '\x1f';
                                                            AVar4.buffer[1] = '\0';
                                                            AVar4.buffer[2] = '\0';
                                                            AVar4.buffer[3] = '\0';
                                                          }
                                                          else {
                                                            AVar4.buffer[0] = '\x1e';
                                                            AVar4.buffer[1] = '\0';
                                                            AVar4.buffer[2] = '\0';
                                                            AVar4.buffer[3] = '\0';
                                                          }
                                                        }
                                                        else {
                                                          AVar4.buffer[0] = '\x1d';
                                                          AVar4.buffer[1] = '\0';
                                                          AVar4.buffer[2] = '\0';
                                                          AVar4.buffer[3] = '\0';
                                                        }
                                                      }
                                                      else {
                                                        AVar4.buffer[0] = '\x1c';
                                                        AVar4.buffer[1] = '\0';
                                                        AVar4.buffer[2] = '\0';
                                                        AVar4.buffer[3] = '\0';
                                                      }
                                                    }
                                                    else {
                                                      AVar4.buffer[0] = '\x1b';
                                                      AVar4.buffer[1] = '\0';
                                                      AVar4.buffer[2] = '\0';
                                                      AVar4.buffer[3] = '\0';
                                                    }
                                                  }
                                                  else {
                                                    AVar4.buffer[0] = '\x1a';
                                                    AVar4.buffer[1] = '\0';
                                                    AVar4.buffer[2] = '\0';
                                                    AVar4.buffer[3] = '\0';
                                                  }
                                                }
                                                else {
                                                  AVar4.buffer[0] = '\x19';
                                                  AVar4.buffer[1] = '\0';
                                                  AVar4.buffer[2] = '\0';
                                                  AVar4.buffer[3] = '\0';
                                                }
                                              }
                                              else {
                                                AVar4.buffer[0] = '\x18';
                                                AVar4.buffer[1] = '\0';
                                                AVar4.buffer[2] = '\0';
                                                AVar4.buffer[3] = '\0';
                                              }
                                            }
                                            else {
                                              AVar4.buffer[0] = '\x17';
                                              AVar4.buffer[1] = '\0';
                                              AVar4.buffer[2] = '\0';
                                              AVar4.buffer[3] = '\0';
                                            }
                                          }
                                          else {
                                            AVar4.buffer[0] = '\x16';
                                            AVar4.buffer[1] = '\0';
                                            AVar4.buffer[2] = '\0';
                                            AVar4.buffer[3] = '\0';
                                          }
                                        }
                                        else {
                                          AVar4.buffer[0] = '\x15';
                                          AVar4.buffer[1] = '\0';
                                          AVar4.buffer[2] = '\0';
                                          AVar4.buffer[3] = '\0';
                                        }
                                      }
                                      else {
                                        AVar4.buffer[0] = '\x14';
                                        AVar4.buffer[1] = '\0';
                                        AVar4.buffer[2] = '\0';
                                        AVar4.buffer[3] = '\0';
                                      }
                                    }
                                    else {
                                      AVar4.buffer[0] = '\x13';
                                      AVar4.buffer[1] = '\0';
                                      AVar4.buffer[2] = '\0';
                                      AVar4.buffer[3] = '\0';
                                    }
                                  }
                                  else {
                                    AVar4.buffer[0] = '\x12';
                                    AVar4.buffer[1] = '\0';
                                    AVar4.buffer[2] = '\0';
                                    AVar4.buffer[3] = '\0';
                                  }
                                }
                                else {
                                  AVar4.buffer[0] = '\x11';
                                  AVar4.buffer[1] = '\0';
                                  AVar4.buffer[2] = '\0';
                                  AVar4.buffer[3] = '\0';
                                }
                              }
                              else {
                                AVar4.buffer[0] = '\x10';
                                AVar4.buffer[1] = '\0';
                                AVar4.buffer[2] = '\0';
                                AVar4.buffer[3] = '\0';
                              }
                            }
                          }
                          else {
                            AVar4.buffer[0] = '\x0e';
                            AVar4.buffer[1] = '\0';
                            AVar4.buffer[2] = '\0';
                            AVar4.buffer[3] = '\0';
                          }
                        }
                        else {
                          AVar4.buffer[0] = '\r';
                          AVar4.buffer[1] = '\0';
                          AVar4.buffer[2] = '\0';
                          AVar4.buffer[3] = '\0';
                        }
                      }
                      else {
                        AVar4.buffer[0] = '\f';
                        AVar4.buffer[1] = '\0';
                        AVar4.buffer[2] = '\0';
                        AVar4.buffer[3] = '\0';
                      }
                    }
                    else {
                      AVar4.buffer[0] = '\v';
                      AVar4.buffer[1] = '\0';
                      AVar4.buffer[2] = '\0';
                      AVar4.buffer[3] = '\0';
                    }
                  }
                  else {
                    AVar4.buffer[0] = '\n';
                    AVar4.buffer[1] = '\0';
                    AVar4.buffer[2] = '\0';
                    AVar4.buffer[3] = '\0';
                  }
                }
                else {
                  AVar4.buffer[0] = '\t';
                  AVar4.buffer[1] = '\0';
                  AVar4.buffer[2] = '\0';
                  AVar4.buffer[3] = '\0';
                }
              }
              else {
                AVar4.buffer[0] = '\b';
                AVar4.buffer[1] = '\0';
                AVar4.buffer[2] = '\0';
                AVar4.buffer[3] = '\0';
              }
            }
            else {
              AVar4.buffer[0] = '\a';
              AVar4.buffer[1] = '\0';
              AVar4.buffer[2] = '\0';
              AVar4.buffer[3] = '\0';
            }
          }
          else {
            AVar4.buffer[0] = '\x06';
            AVar4.buffer[1] = '\0';
            AVar4.buffer[2] = '\0';
            AVar4.buffer[3] = '\0';
          }
        }
        else {
          AVar4.buffer[0] = '\x05';
          AVar4.buffer[1] = '\0';
          AVar4.buffer[2] = '\0';
          AVar4.buffer[3] = '\0';
        }
      }
      else {
        AVar4.buffer[0] = '\x04';
        AVar4.buffer[1] = '\0';
        AVar4.buffer[2] = '\0';
        AVar4.buffer[3] = '\0';
      }
    }
    else {
      AVar4.buffer[0] = '\x03';
      AVar4.buffer[1] = '\0';
      AVar4.buffer[2] = '\0';
      AVar4.buffer[3] = '\0';
    }
  }
  else {
    iVar1 = bcmp(__s1,"ananas",6);
    if (iVar1 == 0) {
      local_30.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x1;
      local_30.Storage.hasVal = true;
      goto LAB_0017364d;
    }
    if ((uVar3 < 8) || (*__s1 != 0x69626164756f6c63)) {
      bVar5 = false;
      goto LAB_0017365d;
    }
    AVar4.buffer[0] = '\x02';
    AVar4.buffer[1] = '\0';
    AVar4.buffer[2] = '\0';
    AVar4.buffer[3] = '\0';
  }
  local_30.Storage.hasVal = true;
  local_30.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
       (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar4.buffer;
LAB_00173b0f:
  pOVar2 = llvm::Optional<llvm::Triple::OSType>::getPointer(&local_30);
  return *pOVar2;
}

Assistant:

static Triple::OSType parseOS(StringRef OSName) {
  return StringSwitch<Triple::OSType>(OSName)
    .StartsWith("ananas", Triple::Ananas)
    .StartsWith("cloudabi", Triple::CloudABI)
    .StartsWith("darwin", Triple::Darwin)
    .StartsWith("dragonfly", Triple::DragonFly)
    .StartsWith("freebsd", Triple::FreeBSD)
    .StartsWith("fuchsia", Triple::Fuchsia)
    .StartsWith("ios", Triple::IOS)
    .StartsWith("kfreebsd", Triple::KFreeBSD)
    .StartsWith("linux", Triple::Linux)
    .StartsWith("lv2", Triple::Lv2)
    .StartsWith("macos", Triple::MacOSX)
    .StartsWith("netbsd", Triple::NetBSD)
    .StartsWith("openbsd", Triple::OpenBSD)
    .StartsWith("solaris", Triple::Solaris)
    .StartsWith("win32", Triple::Win32)
    .StartsWith("windows", Triple::Win32)
    .StartsWith("haiku", Triple::Haiku)
    .StartsWith("minix", Triple::Minix)
    .StartsWith("rtems", Triple::RTEMS)
    .StartsWith("nacl", Triple::NaCl)
    .StartsWith("cnk", Triple::CNK)
    .StartsWith("aix", Triple::AIX)
    .StartsWith("cuda", Triple::CUDA)
    .StartsWith("nvcl", Triple::NVCL)
    .StartsWith("amdhsa", Triple::AMDHSA)
    .StartsWith("ps4", Triple::PS4)
    .StartsWith("elfiamcu", Triple::ELFIAMCU)
    .StartsWith("tvos", Triple::TvOS)
    .StartsWith("watchos", Triple::WatchOS)
    .StartsWith("mesa3d", Triple::Mesa3D)
    .StartsWith("contiki", Triple::Contiki)
    .StartsWith("amdpal", Triple::AMDPAL)
    .Default(Triple::UnknownOS);
}